

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O0

int ravi_resize_array(lua_State *L,RaviArray *t,uint new_size,int initialize)

{
  byte bVar1;
  ulong uVar2;
  char *pcVar3;
  char *local_60;
  lua_Integer *idata;
  lua_Number *ndata;
  char *olddata;
  int was_allocated;
  int number_array;
  uint64_t next_size;
  uint size;
  int initialize_local;
  uint new_size_local;
  RaviArray *t_local;
  lua_State *L_local;
  
  if (((t->flags & 2) == 0) && ((t->flags & 1) == 0)) {
    uVar2 = (ulong)t->size + 10;
    next_size._4_4_ = new_size;
    if ((new_size < uVar2) && (next_size._4_4_ = (uint)uVar2, (uVar2 & 0xffffffff) != uVar2)) {
      next_size._4_4_ = new_size;
    }
    if (t->size < next_size._4_4_) {
      bVar1 = t->flags;
      if (((bVar1 & 4) == 0) && (t->size != 3)) {
        __assert_fail("!was_allocated ? t->size == RAVI_ARRAY_MAX_INLINE : 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.c"
                      ,0x341,"int ravi_resize_array(lua_State *, RaviArray *, unsigned int, int)");
      }
      if ((((bVar1 & 4) == 0) &&
          ((anon_union_24_3_4803335f_for_RaviArray_6 *)t->data != &t->field_6)) &&
         ((anon_union_24_3_4803335f_for_RaviArray_6 *)t->data != &t->field_6)) {
        __assert_fail("!was_allocated ? (t->data == (char*)&t->numarray || t->data == (char*)&t->intarray) : 1"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.c"
                      ,0x342,"int ravi_resize_array(lua_State *, RaviArray *, unsigned int, int)");
      }
      if ((bVar1 & 4) == 0) {
        local_60 = (char *)0x0;
      }
      else {
        local_60 = t->data;
      }
      if ((t->flags & 8) == 0) {
        pcVar3 = (char *)luaM_realloc_(L,local_60,(ulong)t->size << 3,(ulong)next_size._4_4_ << 3);
        t->data = pcVar3;
        if ((bVar1 & 4) == 0) {
          memcpy(t->data,&t->field_6,(ulong)t->size << 3);
        }
        if (initialize != 0) {
          memset(t->data + (ulong)t->len * 8,0,(ulong)(next_size._4_4_ - t->size) << 3);
        }
      }
      else {
        pcVar3 = (char *)luaM_realloc_(L,local_60,(ulong)t->size << 3,(ulong)next_size._4_4_ << 3);
        t->data = pcVar3;
        if ((bVar1 & 4) == 0) {
          memcpy(t->data,&t->field_6,(ulong)t->size << 3);
        }
        if (initialize != 0) {
          memset(t->data + (ulong)t->len * 8,0,(ulong)(next_size._4_4_ - t->size) << 3);
        }
      }
      t->size = next_size._4_4_;
      t->flags = t->flags | 4;
      L_local._4_4_ = 1;
    }
    else {
      L_local._4_4_ = 0;
    }
  }
  else {
    L_local._4_4_ = 0;
  }
  return L_local._4_4_;
}

Assistant:

static int ravi_resize_array(lua_State *L, RaviArray *t, unsigned int new_size, int initialize) {
  if (t->flags & RAVI_ARRAY_FIXEDSIZE || t->flags & RAVI_ARRAY_SLICE) {
    /* cannot resize */
    return 0;
  }
  /* make sure new size is not going to overflow */
  unsigned int size;
  uint64_t next_size = (uint64_t)t->size + 10;
  if (new_size < next_size) {
    size = (unsigned int)next_size;
    if (size != next_size)
      // overflow
      size = new_size;
  }
  else {
    size = new_size;
  }
  if (size <= t->size) {
    // overflow
    return 0;
  }
  /*
  Array could initially be pointing to inline storage so we
  need to be careful when reallocating. Also we allow for lua_Number and
  lua_Integer to be different sizes
  */
  int number_array = t->flags & RAVI_ARRAY_ISFLOAT;
  int was_allocated = t->flags & RAVI_ARRAY_ALLOCATED;
  lua_assert(!was_allocated ? t->size == RAVI_ARRAY_MAX_INLINE : 1);
  lua_assert(!was_allocated ? (t->data == (char*)&t->numarray || t->data == (char*)&t->intarray) : 1);
  char *olddata = was_allocated ? t->data : NULL;  // Not allocated
  if (number_array) {
    t->data = (char *)luaM_reallocv(L, olddata, t->size, size, sizeof(lua_Number));
    if (!was_allocated)
      memcpy(t->data, t->numarray, sizeof(lua_Number) * t->size);
    if (initialize) {
      lua_Number *ndata = (lua_Number *)t->data;
      memset(&ndata[t->len], 0, (size - t->size) * sizeof(lua_Number));
    }
  }
  else {
    t->data = (char *)luaM_reallocv(L, olddata, t->size, size, sizeof(lua_Integer));
    if (!was_allocated)
      memcpy(t->data, t->intarray, sizeof(lua_Integer) * t->size);
    if (initialize) {
      lua_Integer *idata = (lua_Integer *)t->data;
      memset(&idata[t->len], 0, (size - t->size) * sizeof(lua_Integer));
    }
  }
  t->size = size;
  t->flags |= RAVI_ARRAY_ALLOCATED;
  return 1;
}